

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::ForwardDynamicsAccelerationDeltas
               (Model *model,ConstraintSet *CS,VectorNd *QDDot_t,uint body_id,
               vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *f_t)

{
  undefined8 *puVar1;
  double *pdVar2;
  double *pdVar3;
  JointType JVar4;
  uint uVar5;
  long lVar6;
  pointer ppCVar7;
  pointer pJVar8;
  pointer pSVar9;
  pointer pSVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  double dVar15;
  SrcEvaluatorType srcEvaluator_1;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  CustomJoint *pCVar22;
  long lVar23;
  uint uVar24;
  ActualDstType actualDst;
  double *pdVar25;
  Index othersize;
  double dVar26;
  CustomJoint *rows;
  SrcEvaluatorType srcEvaluator;
  long lVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  SpatialVector Xa;
  Vector3d qdd_temp;
  assign_op<double,_double> local_129;
  Matrix<double,_6,_1,_0,_6,_1> local_128;
  ulong local_f0;
  SpatialVector_t local_e8;
  undefined1 local_b8 [16];
  CustomJoint *local_a8;
  CustomJoint *local_a0;
  VectorNd *local_90;
  double local_88;
  long local_78;
  long local_70;
  long local_68;
  vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *local_60;
  double local_58;
  double local_48;
  
  lVar16 = (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(model->mBodies).
                 super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (lVar16 != 0) {
    uVar17 = (lVar16 >> 4) * 0x6db6db6db6db6db7;
    lVar16 = *(long *)(CS + 0x580);
    lVar23 = *(long *)(CS + 0x598);
    lVar27 = *(long *)(CS + 0x5b0);
    lVar6 = *(long *)(CS + 0x600);
    uVar24 = 1;
    uVar19 = 0;
    do {
      lVar14 = uVar19 * 0x30;
      puVar1 = (undefined8 *)(lVar16 + 0x20 + lVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar16 + 0x10 + lVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar16 + lVar14) = 0;
      ((undefined8 *)(lVar16 + lVar14))[1] = 0;
      puVar1 = (undefined8 *)(lVar23 + 0x20 + lVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)(lVar23 + 0x10 + lVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)(lVar23 + lVar14) = 0;
      ((undefined8 *)(lVar23 + lVar14))[1] = 0;
      *(undefined8 *)(lVar27 + uVar19 * 8) = 0;
      *(undefined8 *)(lVar6 + 0x10 + uVar19 * 0x18) = 0;
      puVar1 = (undefined8 *)(lVar6 + uVar19 * 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      uVar19 = (ulong)uVar24;
      uVar24 = uVar24 + 1;
    } while (uVar19 <= uVar17 && uVar17 - uVar19 != 0);
  }
  ppCVar7 = (model->mCustomJoints).
            super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = (long)(model->mCustomJoints).
                 super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar7;
  local_90 = QDDot_t;
  local_60 = f_t;
  if (lVar16 != 0) {
    uVar17 = 0;
    uVar19 = 1;
    do {
      pCVar22 = ppCVar7[uVar17];
      lVar23 = *(long *)(pCVar22 + 0xd0);
      if (0 < lVar23) {
        memset(*(void **)(pCVar22 + 200),0,lVar23 << 3);
      }
      bVar11 = uVar19 < (ulong)(lVar16 >> 3);
      uVar17 = uVar19;
      uVar19 = (ulong)((int)uVar19 + 1);
    } while (bVar11);
  }
  if (body_id != 0) {
    dVar26 = (double)(ulong)body_id;
    local_68 = (long)dVar26 * 0x60;
    local_70 = (long)dVar26 * 0x30;
    local_88 = dVar26;
    do {
      lVar16 = local_70;
      if (dVar26 == local_88) {
        Math::SpatialTransform::applyAdjoint
                  ((SpatialVector *)&local_128,
                   (SpatialTransform *)
                   ((long)&(((model->X_base).
                             super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             .
                             super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                             ._M_impl.super__Vector_impl_data._M_start)->E).super_Matrix3d +
                   local_68),
                   (SpatialVector *)
                   ((long)&(((local_60->
                             super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ).
                             super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super_Matrix<double,_6,_1,_0,_6,_1>).
                           super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + local_70))
        ;
        lVar23 = *(long *)(CS + 0x580);
        *(ulong *)(lVar23 + lVar16) =
             (ulong)local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[0] ^ 0x8000000000000000;
        ((ulong *)(lVar23 + lVar16))[1] =
             (ulong)-local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[1];
        pdVar25 = (double *)(lVar23 + 0x10 + lVar16);
        *pdVar25 = -local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[2];
        pdVar25[1] = -local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[3];
        pdVar25 = (double *)(lVar23 + 0x20 + lVar16);
        *pdVar25 = -local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[4];
        pdVar25[1] = -local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[5];
      }
      pJVar8 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      JVar4 = pJVar8[(long)dVar26].mJointType;
      if (pJVar8[(long)dVar26].mDoFCount == 1) {
        if (JVar4 == JointTypeCustom) goto LAB_00140061;
        pSVar10 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar23 = (long)dVar26 * 0x30;
        lVar16 = *(long *)(CS + 0x580);
        pdVar25 = (double *)
                  ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar18 = (double *)
                  ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        pdVar2 = (double *)(lVar16 + 0x10 + lVar23);
        pdVar3 = (double *)(lVar16 + 0x20 + lVar23);
        dVar28 = -(pdVar18[1] * pdVar3[1] + pdVar25[1] * pdVar2[1] +
                   *(double *)
                    ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                   ((double *)(lVar16 + lVar23))[1] +
                  *pdVar18 * *pdVar3 + *pdVar25 * *pdVar2 +
                  *(double *)
                   &pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                  *(double *)(lVar16 + lVar23));
        *(double *)(*(long *)(CS + 0x5b0) + (long)dVar26 * 8) = dVar28;
        uVar17 = (ulong)(model->lambda).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[(long)dVar26];
        if (uVar17 == 0) goto LAB_00140306;
        pdVar18 = (double *)(lVar23 + lVar16);
        pSVar9 = (model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pSVar10 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_48 = (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[(long)dVar26];
        auVar30._0_8_ =
             *(double *)
              &pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * dVar28;
        auVar30._8_8_ =
             *(double *)
              ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                      super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) * dVar28;
        auVar31._8_8_ = local_48;
        auVar31._0_8_ = local_48;
        auVar31 = divpd(auVar30,auVar31);
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
             auVar31._0_8_ + *pdVar18;
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
             auVar31._8_8_ + pdVar18[1];
        pdVar25 = (double *)
                  ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        auVar32._0_8_ = *pdVar25 * dVar28;
        auVar32._8_8_ = pdVar25[1] * dVar28;
        auVar12._8_8_ = local_48;
        auVar12._0_8_ = local_48;
        auVar31 = divpd(auVar32,auVar12);
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
             auVar31._0_8_ + pdVar18[2];
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
             auVar31._8_8_ + pdVar18[3];
        pdVar25 = (double *)
                  ((long)&pSVar10[(long)dVar26].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        auVar29._0_8_ = dVar28 * *pdVar25;
        auVar29._8_8_ = dVar28 * pdVar25[1];
        auVar13._8_8_ = local_48;
        auVar13._0_8_ = local_48;
        auVar31 = divpd(auVar29,auVar13);
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
             auVar31._0_8_ + pdVar18[4];
        local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
        super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
             auVar31._8_8_ + pdVar18[5];
        local_58 = dVar28;
LAB_001402ab:
        lVar27 = uVar17 * 0x30;
        Math::SpatialTransform::applyTranspose
                  ((SpatialTransform *)((long)pSVar9 + (long)dVar26 * 0x60),&local_e8);
        lVar23 = *(long *)(CS + 0x580);
        dVar28 = ((double *)(lVar16 + lVar27))[1];
        *(double *)(lVar23 + lVar27) =
             *(double *)(lVar16 + lVar27) +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[0];
        ((double *)(lVar23 + lVar27))[1] =
             dVar28 + local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                      m_storage.m_data.array[1];
        pdVar25 = (double *)(lVar16 + 0x10 + lVar27);
        dVar28 = pdVar25[1];
        pdVar18 = (double *)(lVar23 + 0x10 + lVar27);
        *pdVar18 = *pdVar25 +
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[2];
        pdVar18[1] = dVar28 + local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                              .m_storage.m_data.array[3];
        pdVar25 = (double *)(lVar16 + 0x20 + lVar27);
        dVar28 = pdVar25[1];
        pdVar18 = (double *)(lVar23 + 0x20 + lVar27);
        *pdVar18 = *pdVar25 +
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[4];
        pdVar18[1] = dVar28 + local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>
                              .m_storage.m_data.array[5];
      }
      else if (pJVar8[(long)dVar26].mDoFCount == 3) {
        if (JVar4 == JointTypeCustom) {
LAB_00140061:
          local_f0 = (ulong)pJVar8[(long)dVar26].custom_joint_index;
          pCVar22 = (model->mCustomJoints).
                    super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[local_f0];
          lVar23 = (long)dVar26 * 0x30;
          pdVar25 = (double *)(*(long *)(CS + 0x580) + lVar23);
          local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[0] = 0.0;
          local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[1] = 0.0;
          if (*(long *)(pCVar22 + 0x80) == 0) {
            dVar28 = 0.0;
          }
          else {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,
                       *(long *)(pCVar22 + 0x80),1);
            dVar28 = *(double *)(pCVar22 + 0x80);
            if (local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array[1] != dVar28) {
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_128,
                         (Index)dVar28,1);
              dVar28 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[1];
            }
            if (0 < (long)dVar28) {
              lVar16 = *(long *)(pCVar22 + 0x78);
              pdVar18 = (double *)(*(long *)(pCVar22 + 0x70) + 0x20);
              dVar21 = 0.0;
              do {
                *(double *)
                 ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)
                         local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                         m_storage.m_data.array[0])->m_storage + (long)dVar21 * 8) =
                     ((pdVar25[1] * -pdVar18[-3] - pdVar18[-1] * pdVar25[3]) -
                     pdVar18[1] * pdVar25[5]) +
                     ((*pdVar25 * -pdVar18[-4] - pdVar18[-2] * pdVar25[2]) - *pdVar18 * pdVar25[4]);
                dVar21 = (double)((long)dVar21 + 1);
                pdVar18 = pdVar18 + lVar16;
              } while (dVar28 != dVar21);
            }
          }
          dVar21 = local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[0];
          if (*(double *)(pCVar22 + 0xd0) != dVar28) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(pCVar22 + 200),
                       (Index)dVar28,1);
            dVar28 = *(double *)(pCVar22 + 0xd0);
          }
          pdVar25 = ((DenseStorage<double,__1,__1,_1,_0> *)&pCVar22[200].field_0x0)->m_data;
          dVar20 = (double)((long)dVar28 - ((long)dVar28 >> 0x3f) & 0xfffffffffffffffe);
          if (1 < (long)dVar28) {
            lVar16 = 0;
            do {
              pdVar18 = (double *)
                        ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)dVar21)->
                                m_storage + lVar16 * 8);
              dVar15 = pdVar18[1];
              pdVar2 = pdVar25 + lVar16;
              *pdVar2 = *pdVar18;
              pdVar2[1] = dVar15;
              lVar16 = lVar16 + 2;
            } while (lVar16 < (long)dVar20);
          }
          if ((long)dVar20 < (long)dVar28) {
            do {
              pdVar25[(long)dVar20] =
                   *(double *)
                    ((long)&((PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)dVar21)->
                            m_storage + (long)dVar20 * 8);
              dVar20 = (double)((long)dVar20 + 1);
            } while (dVar28 != dVar20);
          }
          free((void *)local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[0]);
          uVar17 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)dVar26];
          if (uVar17 != 0) {
            lVar16 = *(long *)(CS + 0x580);
            pSVar9 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b8._0_8_ = lVar16 + lVar23;
            local_a0 = (model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[local_f0];
            local_b8._8_8_ = local_a0 + 0x88;
            local_a8 = local_a0 + 0xa0;
            local_a0 = local_a0 + 200;
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
                 *(double *)(lVar16 + lVar23);
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
                 (double)((long *)(lVar16 + lVar23))[1];
            puVar1 = (undefined8 *)(lVar16 + 0x10 + lVar23);
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
                 (double)*puVar1;
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
                 (double)puVar1[1];
            pdVar25 = (double *)(lVar16 + 0x20 + lVar23);
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[4] =
                 *pdVar25;
            local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
            super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[5] =
                 pdVar25[1];
            local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
            array[0] = 1.0;
            Eigen::internal::
            generic_product_impl<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,0>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
            ::scaleAndAddTo<Eigen::Matrix<double,6,1,0,6,1>>
                      (&local_e8.super_Matrix<double,_6,_1,_0,_6,_1>,
                       (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>
                        *)(local_b8 + 8),(Matrix<double,__1,_1,_0,__1,_1> *)local_a0,
                       (Scalar *)&local_128);
            goto LAB_001402ab;
          }
        }
        else {
          local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[0] = (double)((model->multdof3_S).
                              super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              .
                              super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + (long)dVar26);
          local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
          array[2] = (double)(*(long *)(CS + 0x580) + (long)dVar26 * 0x30);
          local_f0 = (long)dVar26 * 0x18;
          Vector3_t::operator=
                    ((Vector3_t *)(*(long *)(CS + 0x600) + local_f0),
                     (MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                      *)&local_128);
          uVar17 = (ulong)(model->lambda).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[(long)dVar26];
          if (uVar17 != 0) {
            local_78 = *(long *)(CS + 0x580);
            lVar23 = uVar17 * 0x30;
            pSVar9 = (model->X_lambda).
                     super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     .
                     super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b8._0_8_ = (long)dVar26 * 0x30 + local_78;
            local_b8._8_8_ =
                 (model->multdof3_U).
                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)dVar26;
            local_a8 = (CustomJoint *)
                       ((model->multdof3_Dinv).
                        super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + (long)dVar26);
            local_a0 = (CustomJoint *)(local_f0 + *(long *)(CS + 0x600));
            SpatialVector_t::
            SpatialVector_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,6,1,0,6,1>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,6,3,0,6,3>,Eigen::Matrix<double,3,3,0,3,3>,0>,Eigen::Matrix<double,3,1,0,3,1>,0>const>>
                      (&local_e8,
                       (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                        *)local_b8);
            Math::SpatialTransform::applyTranspose(pSVar9 + (long)dVar26,&local_e8);
            lVar16 = *(long *)(CS + 0x580);
            dVar28 = ((double *)(local_78 + lVar23))[1];
            *(double *)(lVar16 + lVar23) =
                 *(double *)(local_78 + lVar23) +
                 local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                 m_data.array[0];
            ((double *)(lVar16 + lVar23))[1] =
                 dVar28 + local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                          m_storage.m_data.array[1];
            pdVar25 = (double *)(local_78 + 0x10 + lVar23);
            dVar28 = pdVar25[1];
            pdVar18 = (double *)(lVar16 + 0x10 + lVar23);
            *pdVar18 = *pdVar25 +
                       local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[2];
            pdVar18[1] = dVar28 + local_128.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[3];
            pdVar25 = (double *)(local_78 + 0x20 + lVar23);
            dVar28 = pdVar25[1];
            pdVar18 = (double *)(lVar16 + 0x20 + lVar23);
            *pdVar18 = *pdVar25 +
                       local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                       m_storage.m_data.array[4];
            pdVar18[1] = dVar28 + local_128.
                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                                  m_storage.m_data.array[5];
          }
        }
      }
      else if (JVar4 == JointTypeCustom) goto LAB_00140061;
LAB_00140306:
      dVar26 = (double)((long)dVar26 - 1);
    } while (SUB84(dVar26,0) != 0);
  }
  *(local_90->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data = 0.0
  ;
  pSVar10 = (model->a).super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
            super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>._M_impl.
            super__Vector_impl_data._M_start;
  puVar1 = *(undefined8 **)(CS + 0x598);
  dVar26 = *(double *)
            ((long)&(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
  *puVar1 = *(undefined8 *)
             &(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>;
  puVar1[1] = dVar26;
  dVar26 = *(double *)
            ((long)&(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x18);
  puVar1[2] = *(double *)
               ((long)&(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
  puVar1[3] = dVar26;
  dVar26 = *(double *)
            ((long)&(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
                    super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x28);
  puVar1[4] = *(double *)
               ((long)&(pSVar10->super_Matrix<double,_6,_1,_0,_6,_1>).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
  puVar1[5] = dVar26;
  if (1 < (ulong)(((long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(model->mBodies).
                         super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         .
                         super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7)) {
    uVar17 = 1;
    do {
      uVar24 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17].q_index;
      Math::SpatialTransform::apply
                ((model->X_lambda).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,
                 (SpatialVector *)
                 ((ulong)(model->lambda).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar17] * 0x30 + *(long *)(CS + 0x598)));
      pJVar8 = (model->mJoints).
               super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               .
               super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
               ._M_impl.super__Vector_impl_data._M_start;
      JVar4 = pJVar8[uVar17].mJointType;
      if (pJVar8[uVar17].mDoFCount == 1) {
        if (JVar4 == JointTypeCustom) goto LAB_00140619;
        lVar23 = uVar17 * 0x30;
        pSVar10 = (model->U).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pdVar25 = (double *)
                  ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        pdVar18 = (double *)
                  ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        local_88 = (*(double *)(*(long *)(CS + 0x5b0) + uVar17 * 8) -
                   (pdVar18[1] *
                    local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[5] +
                    pdVar25[1] *
                    local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[3] +
                    *(double *)
                     ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                             super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8) *
                    local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[1] +
                   *pdVar18 *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[4] +
                   *pdVar25 *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[2] +
                   *(double *)
                    &pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[0])) /
                   (model->d).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                   m_storage.m_data[uVar17];
        (local_90->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
        [uVar24] = local_88;
        pSVar10 = (model->S).
                  super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        lVar16 = *(long *)(CS + 0x598);
        dVar26 = *(double *)
                  ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 8);
        *(double *)(lVar16 + lVar23) =
             *(double *)
              &pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
               super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> * local_88 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[0];
        ((double *)(lVar16 + lVar23))[1] =
             dVar26 * local_88 +
             local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data
             .array[1];
        pdVar25 = (double *)
                  ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x10);
        dVar26 = pdVar25[1];
        pdVar18 = (double *)(lVar16 + 0x10 + lVar23);
        *pdVar18 = *pdVar25 * local_88 +
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[2];
        pdVar18[1] = dVar26 * local_88 +
                     local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[3];
        pdVar25 = (double *)
                  ((long)&pSVar10[uVar17].super_Matrix<double,_6,_1,_0,_6,_1>.
                          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> + 0x20);
        dVar26 = pdVar25[1];
        pdVar18 = (double *)(lVar16 + 0x20 + lVar23);
        *pdVar18 = local_88 * *pdVar25 +
                   local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array[4];
        pdVar18[1] = local_88 * dVar26 +
                     local_128.super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                     m_storage.m_data.array[5];
      }
      else if (pJVar8[uVar17].mDoFCount == 3) {
        if (JVar4 == JointTypeCustom) {
LAB_00140619:
          uVar5 = pJVar8[uVar17].custom_joint_index;
          rows = (CustomJoint *)
                 (ulong)*(uint *)((model->mCustomJoints).
                                  super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar5] + 8);
          local_b8._0_8_ = (double *)0x0;
          local_b8._8_8_ = (CustomJoint *)0x0;
          Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                    ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b8,
                     (Index)rows,1);
          pCVar22 = rows;
          if ((CustomJoint *)local_b8._8_8_ != rows) {
            Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                      ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_b8,
                       (Index)rows,1);
            pCVar22 = (CustomJoint *)local_b8._8_8_;
          }
          if (0 < (long)pCVar22) {
            memset((void *)local_b8._0_8_,0,(long)pCVar22 << 3);
          }
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)(model->mCustomJoints).
                       super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar5];
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((long)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 0xa0);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((long)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 200);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)((long)local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                              .m_data.array[2] + 0x88);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               (double)&local_128;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,_1,_0,__1,_1> *)local_b8,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>
                      *)&local_e8,&local_129,(type)0x0);
          if (rows != (CustomJoint *)0x0) {
            pdVar25 = (local_90->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            lVar16 = 0;
            do {
              pdVar25[uVar24 + (int)lVar16] = *(double *)(local_b8._0_8_ + lVar16 * 8);
              lVar16 = lVar16 + 1;
            } while (rows != (CustomJoint *)lVar16);
          }
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5] + 0x70);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_b8;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                               *)&local_e8);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((model->mCustomJoints).
                        super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar5] + 0x70);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)&local_128;
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_b8;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)(uVar17 * 0x30 + *(long *)(CS + 0x598)),
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                      *)&local_e8);
          free((void *)local_b8._0_8_);
        }
        else {
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((model->multdof3_Dinv).
                        super__Vector_base<Matrix3_t,_std::allocator<Matrix3_t>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar17);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)(uVar17 * 0x18 + *(long *)(CS + 0x600));
          local_f0 = uVar17 * 0x90;
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)((model->multdof3_U).
                        super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        .
                        super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[3] =
               (double)&local_128;
          Vector3_t::
          Vector3_t<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>,Eigen::Matrix<double,6,1,0,6,1>,0>const>,0>>
                    ((Vector3_t *)local_b8,
                     (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>,_0>_>
                      *)&local_e8);
          uVar19 = local_f0;
          pdVar25 = (local_90->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar25[uVar24] = (double)local_b8._0_8_;
          pdVar25[uVar24 + 1] = (double)local_b8._8_8_;
          pdVar25[uVar24 + 2] = (double)local_a8;
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)((model->a).
                        super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                        super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar17);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((long)&(((model->multdof3_S).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + local_f0);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_b8;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)
                     local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
                     super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.
                     array[0],(MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                               *)&local_e8);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[1] =
               (double)((long)&(((model->multdof3_S).
                                 super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 .
                                 super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>).
                               m_storage + uVar19);
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[0] =
               (double)&local_128;
          local_e8.super_Matrix<double,_6,_1,_0,_6,_1>.
          super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.m_data.array[2] =
               (double)local_b8;
          SpatialVector_t::operator=
                    ((SpatialVector_t *)(uVar17 * 0x30 + *(long *)(CS + 0x598)),
                     (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Product<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>_>
                      *)&local_e8);
        }
      }
      else if (JVar4 == JointTypeCustom) goto LAB_00140619;
      uVar17 = (ulong)((int)uVar17 + 1);
      uVar19 = ((long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(model->mBodies).
                      super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      .
                      super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar17 <= uVar19 && uVar19 - uVar17 != 0);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void ForwardDynamicsAccelerationDeltas (
  Model &model,
  ConstraintSet &CS,
  VectorNd &QDDot_t,
  const unsigned int body_id,
  const std::vector<SpatialVector> &f_t
)
{
  LOG << "-------- " << __func__ << " ------" << std::endl;

  assert (CS.d_pA.size() == model.mBodies.size());
  assert (CS.d_a.size() == model.mBodies.size());
  assert (CS.d_u.size() == model.mBodies.size());

  // TODO reset all values (debug)
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    CS.d_pA[i].setZero();
    CS.d_a[i].setZero();
    CS.d_u[i] = 0.;
    CS.d_multdof3_u[i].setZero();
  }
  for(unsigned int i=0; i<model.mCustomJoints.size(); i++) {
    model.mCustomJoints[i]->d_u.setZero();
  }

  for (unsigned int i = body_id; i > 0; i--) {
    if (i == body_id) {
      CS.d_pA[i] = -model.X_base[i].applyAdjoint(f_t[i]);
    }

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_multdof3_u[i] = - model.multdof3_S[i].transpose() * (CS.d_pA[i]);

      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =   CS.d_pA[lambda]
                            + model.X_lambda[i].applyTranspose (
                              CS.d_pA[i] + (model.multdof3_U[i]
                                            * model.multdof3_Dinv[i]
                                            * CS.d_multdof3_u[i]));
      }
    } else if(model.mJoints[i].mDoFCount == 1
              && model.mJoints[i].mJointType != JointTypeCustom) {
      CS.d_u[i] = - model.S[i].dot(CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];

      if (lambda != 0) {
        CS.d_pA[lambda] = CS.d_pA[lambda]
                          + model.X_lambda[i].applyTranspose (
                            CS.d_pA[i] + model.U[i] * CS.d_u[i] / model.d[i]);
      }
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {

      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      //CS.
      model.mCustomJoints[kI]->d_u =
        - model.mCustomJoints[kI]->S.transpose() * (CS.d_pA[i]);
      unsigned int lambda = model.lambda[i];
      if (lambda != 0) {
        CS.d_pA[lambda] =
          CS.d_pA[lambda]
          + model.X_lambda[i].applyTranspose (
            CS.d_pA[i] + (   model.mCustomJoints[kI]->U
                             * model.mCustomJoints[kI]->Dinv
                             * model.mCustomJoints[kI]->d_u)
          );
      }
    }
  }

  for (unsigned int i = 0; i < f_t.size(); i++) {
    LOG << "f_t[" << i << "] = " << f_t[i].transpose() << std::endl;
  }

  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_pA[i] " << CS.d_pA[i].transpose() << std::endl;
  }
  for (unsigned int i = 0; i < model.mBodies.size(); i++) {
    LOG << "i = " << i << ": d_u[i] = " << CS.d_u[i] << std::endl;
  }

  QDDot_t[0] = 0.;
  CS.d_a[0] = model.a[0];

  for (unsigned int i = 1; i < model.mBodies.size(); i++) {
    unsigned int q_index = model.mJoints[i].q_index;
    unsigned int lambda = model.lambda[i];

    SpatialVector Xa = model.X_lambda[i].apply(CS.d_a[lambda]);

    if (model.mJoints[i].mDoFCount == 3
        && model.mJoints[i].mJointType != JointTypeCustom) {
      Vector3d qdd_temp = model.multdof3_Dinv[i]
                          * (CS.d_multdof3_u[i] - model.multdof3_U[i].transpose() * Xa);

      QDDot_t[q_index] = qdd_temp[0];
      QDDot_t[q_index + 1] = qdd_temp[1];
      QDDot_t[q_index + 2] = qdd_temp[2];
      model.a[i] = model.a[i] + model.multdof3_S[i] * qdd_temp;
      CS.d_a[i] = Xa + model.multdof3_S[i] * qdd_temp;
    } else if (model.mJoints[i].mDoFCount == 1
               && model.mJoints[i].mJointType != JointTypeCustom) {

      QDDot_t[q_index] = (CS.d_u[i] - model.U[i].dot(Xa) ) / model.d[i];
      CS.d_a[i] = Xa + model.S[i] * QDDot_t[q_index];
    } else if (model.mJoints[i].mJointType == JointTypeCustom) {
      unsigned int kI     = model.mJoints[i].custom_joint_index;
      unsigned int dofI   = model.mCustomJoints[kI]->mDoFCount;
      VectorNd qdd_temp = VectorNd::Zero(dofI);

      qdd_temp = model.mCustomJoints[kI]->Dinv
                 * (model.mCustomJoints[kI]->d_u
                    - model.mCustomJoints[kI]->U.transpose() * Xa);

      for(int z=0; z<dofI; ++z) {
        QDDot_t[q_index+z] = qdd_temp[z];
      }

      model.a[i] = model.a[i] + model.mCustomJoints[kI]->S * qdd_temp;
      CS.d_a[i] = Xa + model.mCustomJoints[kI]->S * qdd_temp;
    }

    LOG << "QDDot_t[" << i - 1 << "] = " << QDDot_t[i - 1] << std::endl;
    LOG << "d_a[i] = " << CS.d_a[i].transpose() << std::endl;
  }
}